

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O2

REF_STATUS
ref_search_gather_seg
          (REF_SEARCH ref_search,REF_DBL *xyz,REF_INT parent,REF_DBL *position,REF_DBL *distance)

{
  uint uVar1;
  REF_STATUS RVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  char *pcVar6;
  double dVar7;
  double dVar8;
  REF_DBL element_dist;
  
  RVar2 = 0;
  if (parent != -1 && ref_search->n != 0) {
    if (parent < 0 || ref_search->n <= parent) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",0xed
             ,"ref_search_gather_seg","parent invalid");
      printf("%d n %d parent\n",(ulong)(uint)ref_search->n,(ulong)(uint)parent);
      RVar2 = 1;
    }
    else if (ref_search->item[(uint)parent] != -1) {
      uVar1 = ref_search->d;
      uVar4 = 0;
      uVar3 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar3 = uVar4;
      }
      dVar7 = 0.0;
      for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        dVar8 = position[uVar4] - ref_search->pos[(long)(int)(parent * uVar1) + uVar4];
        dVar7 = dVar7 + dVar8 * dVar8;
      }
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar8 = *distance;
      if (dVar7 - ref_search->radius[(uint)parent] <= dVar8) {
        ref_search_distance2
                  (xyz + (long)ref_search->item[(uint)parent] * 6,
                   xyz + (long)ref_search->item[(uint)parent] * 6 + 3,position,&element_dist);
        if (element_dist <= dVar8) {
          dVar8 = element_dist;
        }
        *distance = dVar8;
      }
      RVar2 = 0;
      if (dVar7 - ref_search->children_ball[(uint)parent] <= dVar8) {
        RVar2 = ref_search_gather_seg
                          (ref_search,xyz,ref_search->left[(uint)parent],position,distance);
        if (RVar2 == 0) {
          RVar2 = ref_search_gather_seg
                            (ref_search,xyz,ref_search->right[(uint)parent],position,distance);
          if (RVar2 == 0) {
            return 0;
          }
          pcVar6 = "gthr right";
          uVar5 = 0x108;
        }
        else {
          pcVar6 = "gthr left";
          uVar5 = 0x105;
        }
        RVar2 = 1;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_search.c",
               uVar5,"ref_search_gather_seg",1,pcVar6);
      }
    }
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_search_gather_seg(REF_SEARCH ref_search,
                                                REF_DBL *xyz, REF_INT parent,
                                                REF_DBL *position,
                                                REF_DBL *distance) {
  REF_INT i;
  REF_DBL dist;

  if (0 == ref_search->n) return REF_SUCCESS;  /* tree empty */
  if (REF_EMPTY == parent) return REF_SUCCESS; /* finished traversing */
  RAB(0 <= parent && parent < ref_search->n, "parent invalid",
      { printf("%d n %d parent\n", ref_search->n, parent); })
  /* finished traversing */
  if (REF_EMPTY == ref_search->item[parent]) return REF_SUCCESS;

  dist = 0.0;
  for (i = 0; i < ref_search->d; i++)
    dist += pow(position[i] - ref_search->pos[i + ref_search->d * parent], 2);
  dist = sqrt(dist);

  /* if the distance between me and the target are less than combined radii */
  if (dist - ref_search->radius[parent] <= *distance) {
    REF_INT element = ref_search->item[parent];
    REF_DBL element_dist;
    RSS(ref_search_distance2(&(xyz[0 + 6 * element]), &(xyz[3 + 6 * element]),
                             position, &element_dist),
        "dist2");
    *distance = MIN(*distance, element_dist);
  }

  /* if the distance between me and the target are less than children
   * children_ball includes child radii, so only subtract target radius */
  if (*distance >= dist - ref_search->children_ball[parent]) {
    RSS(ref_search_gather_seg(ref_search, xyz, ref_search->left[parent],
                              position, distance),
        "gthr left");
    RSS(ref_search_gather_seg(ref_search, xyz, ref_search->right[parent],
                              position, distance),
        "gthr right");
  }

  return REF_SUCCESS;
}